

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O2

int __thiscall Fl_Input::kf_lines_up(Fl_Input *this,int repeat_num)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = (this->super_Fl_Input_).position_;
  iVar2 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar5);
  if (iVar2 == 0) {
    bVar1 = Fl::option(OPTION_ARROW_FOCUS);
    uVar4 = (uint)!bVar1;
  }
  else {
    iVar2 = repeat_num + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) goto LAB_001b6f0a;
      iVar3 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar5);
      iVar5 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar5 = 0;
LAB_001b6f0a:
    iVar5 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar5);
    shift_up_down_position(this,iVar5);
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int Fl_Input::kf_lines_up(int repeat_num) {
  int i = position();
  if (!line_start(i)) {
    //UNNEEDED if (input_type()==FL_MULTILINE_INPUT && !Fl::option(Fl::OPTION_ARROW_FOCUS)) return 1;
    return NORMAL_INPUT_MOVE;
  }
  while(repeat_num--) {
    i = line_start(i);
    if (!i) break;
    i--;
  }
  shift_up_down_position(line_start(i));
  return 1;
}